

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfonticonengine.cpp
# Opt level: O0

void __thiscall
QFontIconEngine::paint(QFontIconEngine *this,QPainter *painter,QRect *rect,Mode mode,State state)

{
  qreal ypos;
  QColor color_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  QColor *pQVar7;
  QFontEngine *pQVar8;
  uint in_ECX;
  QString *in_RDX;
  undefined8 in_RSI;
  QFontPrivate *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  int glyph_height;
  int glyph_width;
  int glyph_y;
  int glyph_x;
  QFontEngine *engine;
  QPointF topLeft;
  QRectF pathBoundingRect;
  QPainterPath path;
  QFixedPoint pt;
  glyph_metrics_t gm;
  glyph_t glyphIndex;
  QString text;
  QPalette palette;
  QColor color;
  QFont renderFont;
  QFixed in_stack_fffffffffffffe38;
  QFixed in_stack_fffffffffffffe3c;
  QFontEngine *in_stack_fffffffffffffe40;
  QRectF *in_stack_fffffffffffffe48;
  QPointF *p1;
  QColor *in_stack_fffffffffffffe50;
  QPointF *offset;
  QPainter *in_stack_fffffffffffffe68;
  PenStyle style;
  QFontPrivate *r;
  QPainter *in_stack_fffffffffffffea8;
  QPainter *in_stack_fffffffffffffeb8;
  QRectF local_d0;
  uint local_ac;
  undefined1 *local_a8;
  QFixed local_9c;
  QFixed local_98;
  undefined1 *local_94;
  undefined4 local_8c;
  QFixed local_88;
  undefined4 local_84;
  QFixed local_80;
  undefined8 local_7c;
  undefined8 local_74;
  undefined1 *local_6c;
  uint local_64;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  iVar2 = (int)((ulong)in_RSI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  r = in_RDI;
  QPainter::save(in_stack_fffffffffffffe68);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)in_stack_fffffffffffffe40,
               (QFont *)CONCAT44(in_stack_fffffffffffffe3c.val,in_stack_fffffffffffffe38.val));
  QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe3c.val,in_stack_fffffffffffffe38.val));
  QFont::setPixelSize((QFont *)in_stack_fffffffffffffe48,
                      (int)((ulong)in_stack_fffffffffffffe40 >> 0x20));
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QColor::QColor(in_stack_fffffffffffffe50,(GlobalColor)((ulong)in_stack_fffffffffffffe48 >> 0x20));
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)
                     CONCAT44(in_stack_fffffffffffffe3c.val,in_stack_fffffffffffffe38.val));
  uVar6 = (ulong)in_ECX;
  switch(uVar6) {
  case 0:
    pQVar7 = QPalette::color((QPalette *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c.val,
                             in_stack_fffffffffffffe38.val);
    local_28 = *(undefined1 **)pQVar7;
    puStack_20 = (undefined1 *)CONCAT26(puStack_20._6_2_,*(undefined6 *)((long)&pQVar7->ct + 4));
    break;
  case 1:
    pQVar7 = QPalette::color((QPalette *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c.val,
                             in_stack_fffffffffffffe38.val);
    local_28 = *(undefined1 **)pQVar7;
    puStack_20 = (undefined1 *)CONCAT26(puStack_20._6_2_,*(undefined6 *)((long)&pQVar7->ct + 4));
    break;
  case 2:
    pQVar7 = QPalette::color((QPalette *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c.val,
                             in_stack_fffffffffffffe38.val);
    local_28 = *(undefined1 **)pQVar7;
    puStack_20 = (undefined1 *)CONCAT26(puStack_20._6_2_,*(undefined6 *)((long)&pQVar7->ct + 4));
    break;
  case 3:
    pQVar7 = QPalette::color((QPalette *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c.val,
                             in_stack_fffffffffffffe38.val);
    local_28 = *(undefined1 **)pQVar7;
    puStack_20 = (undefined1 *)CONCAT26(puStack_20._6_2_,*(undefined6 *)((long)&pQVar7->ct + 4));
  }
  style = (PenStyle)(uVar6 >> 0x20);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)((long)*(__uniq_ptr_data<QPainterPrivate,_std::default_delete<QPainterPrivate>,_true,_true>
                       *)in_RDI + 0x80))(&local_60);
  bVar1 = QString::isEmpty((QString *)0x2876ce);
  if (bVar1) {
    local_64 = (**(code **)((long)*(unique_ptr<QPainterPrivate,_std::default_delete<QPainterPrivate>_>
                                    *)in_RDI + 0x88))();
    if (local_64 != 0) {
      QFontPrivate::get((QFont *)0x28774c);
      pQVar8 = QFontPrivate::engineForScript(in_RDI,(int)((ulong)in_stack_fffffffffffffe50 >> 0x20))
      ;
      local_7c = &DAT_aaaaaaaaaaaaaaaa;
      local_74 = &DAT_aaaaaaaaaaaaaaaa;
      local_6c = &DAT_aaaaaaaaaaaaaaaa;
      (*pQVar8->_vptr_QFontEngine[0x1c])(&local_7c,pQVar8,(ulong)local_64);
      QFixed::toReal((QFixed *)&local_7c);
      iVar2 = qFloor<double>(1.31030655867911e-317);
      QFixed::toReal((QFixed *)((long)&local_7c + 4));
      iVar3 = qFloor<double>(1.3103194043859e-317);
      local_84 = (undefined4)local_74;
      local_80 = QFixed::operator+((QFixed *)
                                   CONCAT44(in_stack_fffffffffffffe3c.val,
                                            in_stack_fffffffffffffe38.val),
                                   (int)in_stack_fffffffffffffe40);
      QFixed::toReal(&local_80);
      iVar4 = qCeil<double>(1.31035053052159e-317);
      local_8c = local_74._4_4_;
      local_88 = QFixed::operator+((QFixed *)
                                   CONCAT44(in_stack_fffffffffffffe3c.val,
                                            in_stack_fffffffffffffe38.val),
                                   (int)in_stack_fffffffffffffe40);
      QFixed::toReal(&local_88);
      iVar5 = qCeil<double>(1.31038560918245e-317);
      if ((0 < iVar4 - iVar2) && (0 < iVar5 - iVar3)) {
        local_94 = &DAT_aaaaaaaaaaaaaaaa;
        QFixed::QFixed(&local_98,-iVar2);
        QFixed::QFixed(&local_9c,-iVar3);
        QFixedPoint::QFixedPoint
                  ((QFixedPoint *)0x2878c8,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38);
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        QPainterPath::QPainterPath((QPainterPath *)0x2878e4);
        in_stack_fffffffffffffe40 = pQVar8;
        QPainterPath::setFillRule
                  ((QPainterPath *)in_stack_fffffffffffffe50,
                   (FillRule)((ulong)in_stack_fffffffffffffe48 >> 0x20));
        pQVar8 = in_stack_fffffffffffffe40;
        memset(&local_ac,0,4);
        QFlags<QTextItem::RenderFlag>::QFlags((QFlags<QTextItem::RenderFlag> *)0x287921);
        (*in_stack_fffffffffffffe40->_vptr_QFontEngine[0xf])
                  (in_stack_fffffffffffffe40,&local_64,&local_94,1,&local_a8,(ulong)local_ac);
        local_d0.xp = -NAN;
        local_d0.yp = -NAN;
        local_d0.w = -NAN;
        local_d0.h = -NAN;
        QPainterPath::boundingRect((QPainterPath *)in_stack_fffffffffffffe50);
        QRect::topLeft((QRect *)CONCAT44(in_stack_fffffffffffffe3c.val,in_stack_fffffffffffffe38.val
                                        ));
        QPointF::QPointF((QPointF *)in_stack_fffffffffffffe40,
                         (QPoint *)
                         CONCAT44(in_stack_fffffffffffffe3c.val,in_stack_fffffffffffffe38.val));
        QRectF::topLeft(in_stack_fffffffffffffe48);
        ::operator-((QPointF *)in_stack_fffffffffffffe48,(QPointF *)in_stack_fffffffffffffe40);
        iVar2 = QRect::width((QRect *)CONCAT44(in_stack_fffffffffffffe3c.val,
                                               in_stack_fffffffffffffe38.val));
        p1 = (QPointF *)(double)iVar2;
        iVar2 = QRect::height((QRect *)CONCAT44(in_stack_fffffffffffffe3c.val,
                                                in_stack_fffffffffffffe38.val));
        QPointF::QPointF((QPointF *)&stack0xfffffffffffffeb8,(qreal)p1,(double)iVar2);
        offset = (QPointF *)QRectF::width(&local_d0);
        ypos = QRectF::height(&local_d0);
        QPointF::QPointF((QPointF *)&stack0xfffffffffffffea8,(qreal)offset,ypos);
        ::operator-(p1,(QPointF *)in_stack_fffffffffffffe40);
        operator/(p1,(qreal)in_stack_fffffffffffffe40);
        ::operator+(p1,(QPointF *)in_stack_fffffffffffffe40);
        QPainter::translate((QPainter *)in_RDI,offset);
        QPainter::setRenderHint
                  ((QPainter *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c.val,
                   SUB41((uint)in_stack_fffffffffffffe38.val >> 0x18,0));
        QPainter::setPen((QPainter *)in_stack_fffffffffffffe40,style);
        local_48 = local_28;
        local_40 = puStack_20;
        color_00.ct._4_4_ = in_R8D;
        color_00._0_8_ = pQVar8;
        color_00._12_4_ = in_ECX;
        QPainter::setBrush((QPainter *)
                           CONCAT44(in_stack_fffffffffffffe3c.val,in_stack_fffffffffffffe38.val),
                           color_00);
        QPainter::drawPath((QPainter *)offset,(QPainterPath *)p1);
        QPainterPath::~QPainterPath((QPainterPath *)0x287b8f);
      }
    }
  }
  else {
    QPainter::setFont((QPainter *)in_RDI,(QFont *)in_stack_fffffffffffffe50);
    QPainter::setPen((QPainter *)in_stack_fffffffffffffe48,(QColor *)in_stack_fffffffffffffe40);
    QPainter::drawText(in_stack_fffffffffffffea8,(QRect *)r,iVar2,in_RDX,
                       (QRect *)CONCAT44(in_ECX,in_R8D));
  }
  QPainter::restore(in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x287baa);
  QPalette::~QPalette((QPalette *)in_stack_fffffffffffffe40);
  QFont::~QFont((QFont *)0x287bc4);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFontIconEngine::paint(QPainter *painter, const QRect &rect, QIcon::Mode mode, QIcon::State state)
{
    Q_UNUSED(state);

    painter->save();
    QFont renderFont(m_iconFont);
    renderFont.setPixelSize(rect.height());

    QColor color = Qt::black;
    QPalette palette;
    switch (mode) {
    case QIcon::Active:
        color = palette.color(QPalette::Active, QPalette::Text);
        break;
    case QIcon::Normal:
        color = palette.color(QPalette::Active, QPalette::Text);
        break;
    case QIcon::Disabled:
        color = palette.color(QPalette::Disabled, QPalette::Text);
        break;
    case QIcon::Selected:
        color = palette.color(QPalette::Active, QPalette::HighlightedText);
        break;
    }

    const QString text = string();
    if (!text.isEmpty()) {
        painter->setFont(renderFont);
        painter->setPen(color);
        painter->drawText(rect, Qt::AlignCenter, text);
    } else if (glyph_t glyphIndex = glyph()) {
        QFontEngine *engine = QFontPrivate::get(renderFont)->engineForScript(QChar::Script_Common);

        const glyph_metrics_t gm = engine->boundingBox(glyphIndex);
        const int glyph_x = qFloor(gm.x.toReal());
        const int glyph_y = qFloor(gm.y.toReal());
        const int glyph_width = qCeil((gm.x + gm.width).toReal()) - glyph_x;
        const int glyph_height = qCeil((gm.y + gm.height).toReal()) - glyph_y;

        if (glyph_width > 0 && glyph_height > 0) {
            QFixedPoint pt(QFixed(-glyph_x), QFixed(-glyph_y));
            QPainterPath path;
            path.setFillRule(Qt::WindingFill);
            engine->addGlyphsToPath(&glyphIndex, &pt, 1, &path, {});
            // make the glyph fit tightly into rect
            const QRectF pathBoundingRect = path.boundingRect();
            // center the glyph inside the rect
            const QPointF topLeft = rect.topLeft() - pathBoundingRect.topLeft()
                            + (QPointF(rect.width(), rect.height())
                                - QPointF(pathBoundingRect.width(), pathBoundingRect.height())) / 2;
            painter->translate(topLeft);

            painter->setRenderHint(QPainter::Antialiasing);
            painter->setPen(Qt::NoPen);
            painter->setBrush(color);
            painter->drawPath(path);
        }
    }
    painter->restore();
}